

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
* __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
::operator=(maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
            *this,maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
                  *other)

{
  view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *val;
  maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
  *other_local;
  maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
  *this_local;
  
  if (this != other) {
    if ((other->m_empty & 1U) == 0) {
      val = operator*(other);
      reset(this,val);
      reset(other);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }